

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcList.c
# Opt level: O0

void Mvc_CoverAddDupCubeTail(Mvc_Cover_t *pCover,Mvc_Cube_t *pCube)

{
  Mvc_Cube_t *pMVar1;
  Mvc_List_t *pList;
  int _i_;
  Mvc_Cube_t *pCubeNew;
  Mvc_Cube_t *pCube_local;
  Mvc_Cover_t *pCover_local;
  
  pMVar1 = Mvc_CubeAlloc(pCover);
  if ((*(uint *)&pMVar1->field_0x8 & 0xffffff) == 0) {
    pMVar1->pData[0] = pCube->pData[0];
  }
  else if ((*(uint *)&pMVar1->field_0x8 & 0xffffff) == 1) {
    pMVar1->pData[0] = pCube->pData[0];
    *(undefined4 *)&pMVar1->field_0x14 = *(undefined4 *)&pCube->field_0x14;
  }
  else {
    for (pList._4_4_ = *(uint *)&pMVar1->field_0x8 & 0xffffff; -1 < (int)pList._4_4_;
        pList._4_4_ = pList._4_4_ - 1) {
      pMVar1->pData[(int)pList._4_4_] = pCube->pData[(int)pList._4_4_];
    }
  }
  if ((pCover->lCubes).pHead == (Mvc_Cube_t *)0x0) {
    (pCover->lCubes).pHead = pMVar1;
  }
  else {
    ((pCover->lCubes).pTail)->pNext = pMVar1;
  }
  (pCover->lCubes).pTail = pMVar1;
  pMVar1->pNext = (Mvc_Cube_t *)0x0;
  (pCover->lCubes).nItems = (pCover->lCubes).nItems + 1;
  return;
}

Assistant:

void Mvc_CoverAddDupCubeTail( Mvc_Cover_t * pCover, Mvc_Cube_t * pCube )
{
    Mvc_Cube_t * pCubeNew;
    // copy the cube as part of this cover
    pCubeNew = Mvc_CubeAlloc( pCover );
    Mvc_CubeBitCopy( pCubeNew, pCube );
    // clean the last bits of the new cube
//    pCubeNew->pData[pCubeNew->iLast] &= (BITS_FULL >> pCubeNew->nUnused);
    // add the cube at the end
    Mvc_CoverAddCubeTail( pCover, pCubeNew );
}